

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSourceFile.cxx
# Opt level: O2

string * __thiscall cmSourceFile::GetOrDetermineLanguage_abi_cxx11_(cmSourceFile *this)

{
  cmValue cVar1;
  string ext;
  string sStack_38;
  
  cVar1 = GetProperty(this,&propLANGUAGE_abi_cxx11_);
  if (cVar1.Value == (string *)0x0) {
    if ((this->Language)._M_string_length == 0) {
      if ((((this->FullPath)._M_string_length == 0) && ((this->Location).AmbiguousExtension == true)
          ) && ((this->Location).AmbiguousDirectory == true)) {
        ResolveFullPath(this,(string *)0x0,(string *)0x0);
      }
      else {
        cmsys::SystemTools::GetFilenameLastExtension(&sStack_38,&(this->Location).Name);
        CheckLanguage(this,&sStack_38);
        std::__cxx11::string::~string((string *)&sStack_38);
      }
    }
  }
  else {
    std::__cxx11::string::_M_assign((string *)&this->Language);
  }
  return &this->Language;
}

Assistant:

std::string const& cmSourceFile::GetOrDetermineLanguage()
{
  // If the language was set explicitly by the user then use it.
  if (cmValue lang = this->GetProperty(propLANGUAGE)) {
    // Assign to member in order to return a reference.
    this->Language = *lang;
    return this->Language;
  }

  // Perform computation needed to get the language if necessary.
  if (this->Language.empty()) {
    // If a known extension is given or a known full path is given then trust
    // that the current extension is sufficient to determine the language. This
    // will fail only if the user specifies a full path to the source but
    // leaves off the extension, which is kind of weird.
    if (this->FullPath.empty() && this->Location.ExtensionIsAmbiguous() &&
        this->Location.DirectoryIsAmbiguous()) {
      // Finalize the file location to get the extension and set the language.
      this->ResolveFullPath();
    } else {
      // Use the known extension to get the language if possible.
      std::string ext =
        cmSystemTools::GetFilenameLastExtension(this->Location.GetName());
      this->CheckLanguage(ext);
    }
  }

  // Use the language determined from the file extension.
  return this->Language;
}